

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
MinVR::VRDataIndex::getValueWithDefault<std::vector<float,std::allocator<float>>>
          (VRDataIndex *this,string *key,vector<float,_std::allocator<float>_> *defaultVal,
          string *nameSpace,bool inherit)

{
  bool bVar1;
  const_iterator __x;
  pointer ppVar2;
  VRDatum *pVVar3;
  vector<float,_std::allocator<float>_> *in_RDI;
  string *in_R8;
  byte in_R9B;
  iterator p;
  bool in_stack_00000107;
  string *in_stack_00000108;
  string *in_stack_00000110;
  VRDataIndex *in_stack_00000118;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
  *in_stack_ffffffffffffff38;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  in_stack_ffffffffffffff90;
  string local_58 [32];
  iterator local_38;
  byte local_29;
  
  local_29 = in_R9B & 1;
  std::__cxx11::string::string(local_58,in_R8);
  local_38._M_node =
       (_Base_ptr)_getEntry(in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000107)
  ;
  std::__cxx11::string::~string(local_58);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  ::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
              *)&stack0xffffffffffffff90,&local_38);
  __x = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
        ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffff90,(_Self *)&stack0xffffffffffffff88);
  if (bVar1) {
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff90._M_node,
               (vector<float,_std::allocator<float>_> *)__x._M_node);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
                           *)0x18ca99);
    pVVar3 = VRDatumPtr::operator->(&ppVar2->second);
    (*pVVar3->_vptr_VRDatum[3])();
    VRDatumConverter::operator_cast_to_vector
              ((VRDatumConverter<MinVR::VRDatum> *)in_stack_ffffffffffffff38);
  }
  return in_RDI;
}

Assistant:

T getValueWithDefault(const std::string &key,
                        const T &defaultVal,
                        const std::string nameSpace = "",
                        const bool inherit = true) const {
    VRDataMap::iterator p =
      const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit);

    if (p == _theIndex.end()) {
      return defaultVal;
    } else {
      return p->second->getValue();
    }
  }